

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
AddBotsIRCCommand::trigger
          (AddBotsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  size_type __pos;
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  long *plVar5;
  char *pcVar6;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  split_parameters;
  string cmd;
  long *local_68;
  long *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar6 = channel._M_str;
  sVar4 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar4,pcVar6,pcVar6,nick._M_len,nick._M_str);
  if (lVar3 == 0) {
    return;
  }
  RenX::getCore();
  Jupiter::IRC::Client::getChannel(source,sVar4,pcVar6);
  Jupiter::IRC::Client::Channel::getType();
  RenX::Core::getServers((int)&local_68);
  if (local_68 == local_60) {
    Jupiter::IRC::Client::sendMessage
              (source,sVar4,pcVar6,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
    goto LAB_00130ecd;
  }
  cmd._M_dataplus._M_p = (pointer)parameters._M_len;
  cmd._M_string_length = (size_type)parameters._M_str;
  local_50._M_dataplus._M_p = (pointer)0x2;
  local_50._M_string_length = 0x13bb6d;
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&cmd,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_50);
  if (split_parameters.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      split_parameters.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar1 = 1;
    split_parameters.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         split_parameters.
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
LAB_00130da1:
    cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
    cmd._M_string_length = 0;
    cmd.field_2._M_local_buf[0] = '\0';
    if ((ulong)((long)split_parameters.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)split_parameters.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      pcVar6 = "addbots ";
LAB_00130de6:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&cmd,pcVar6);
    }
    else {
      uVar2 = RenX::getTeam(split_parameters.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_len,
                            split_parameters.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_str);
      if (uVar2 < 4) {
        pcVar6 = &DAT_0013b7b8 + *(int *)(&DAT_0013b7b8 + (ulong)uVar2 * 4);
        goto LAB_00130de6;
      }
    }
    for (plVar5 = local_68; __pos = cmd._M_string_length, plVar5 != local_60; plVar5 = plVar5 + 1) {
      if (*plVar5 == 0) {
        lVar3 = 0;
      }
      else {
        string_printf_abi_cxx11_(&local_50,"%u",iVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&cmd,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        RenX::Server::send(*plVar5,cmd._M_string_length,cmd._M_dataplus._M_p);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&cmd,__pos,0xffffffffffffffff);
        lVar3 = *plVar5;
      }
      string_printf_abi_cxx11_(&local_50,"%u bots have been added to the server.",iVar1);
      RenX::Server::sendMessage(lVar3,local_50._M_string_length,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&cmd);
  }
  else {
    iVar1 = Jupiter_strtoi_s((split_parameters.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_str,
                             (split_parameters.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_len,0);
    if (iVar1 != 0) goto LAB_00130da1;
    Jupiter::IRC::Client::sendMessage
              (source,sVar4,pcVar6,0x41,
               "Error: Invalid amount entered. Amount must be a positive integer.");
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&split_parameters.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
LAB_00130ecd:
  std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
            ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_68);
  return;
}

Assistant:

void AddBotsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(source->getChannel(channel)->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	int amount = 1;
	std::vector<std::string_view> split_parameters = jessilib::word_split_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.empty()) {
		amount = Jupiter::asInt(split_parameters.front());
		if (amount == 0) {
			source->sendMessage(channel, "Error: Invalid amount entered. Amount must be a positive integer."sv);
			return;
		}
	}

	std::string cmd;
	RenX::TeamType team = RenX::TeamType::None;
	if (split_parameters.size() >= 2) {
		team = RenX::getTeam(split_parameters[1]);
	}

	switch (team) {
	case RenX::TeamType::GDI:
		cmd = "addredbots ";
		break;
	case RenX::TeamType::Nod:
		cmd = "addbluebots ";
		break;
	case RenX::TeamType::None:
	case RenX::TeamType::Other:
		cmd = "addbots ";
		break;
	}

	for (const auto& server : servers) {
		size_t base_length = cmd.size();
		if (server != nullptr) {
			cmd += string_printf("%u", amount);
			server->send(cmd);
			cmd.erase(base_length);
		}
		server->sendMessage(string_printf("%u bots have been added to the server.", amount));
	}
}